

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

NonBondedInteractionType * __thiscall
OpenMD::ForceField::getNonBondedInteractionType(ForceField *this,string *at1,string *at2)

{
  bool bVar1;
  iterator this_00;
  iterator keys_00;
  NonBondedInteractionType *bestType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  NonBondedInteractionType *nbiType_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundNBI;
  int nbiTypeScore;
  int jj;
  int ii;
  iterator j;
  iterator i;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  AtomType *atype2;
  AtomType *atype1;
  NonBondedInteractionType *nbiType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  AtomType *in_stack_fffffffffffffdd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde0;
  value_type *in_stack_fffffffffffffde8;
  __normal_iterator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  __last;
  __normal_iterator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  in_stack_fffffffffffffdf0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe30;
  KeyType *in_stack_fffffffffffffe50;
  AtomType *in_stack_fffffffffffffe58;
  string local_178 [32];
  string local_158 [56];
  AtomType **local_120;
  AtomType **local_118;
  AtomType **local_110;
  AtomType **local_108;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  int local_e0;
  int local_dc;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_d8;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_d0 [2];
  string *in_stack_ffffffffffffff40;
  KeyType *in_stack_ffffffffffffff48;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_ffffffffffffff50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [2];
  ElemPtr local_8;
  
  __x = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1cecbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
  local_8 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::find
                      ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                       in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  if (local_8 == (ElemPtr)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1ced6c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
    TypeContainer<OpenMD::AtomType,_1>::find
              ((TypeContainer<OpenMD::AtomType,_1> *)in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1cedbc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
    TypeContainer<OpenMD::AtomType,_1>::find
              ((TypeContainer<OpenMD::AtomType,_1> *)in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50);
    AtomType::allYourBase(in_stack_fffffffffffffe58);
    AtomType::allYourBase(in_stack_fffffffffffffe58);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(local_d0);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
    ::__normal_iterator(&local_d8);
    local_dc = 0;
    local_e0 = 0;
    std::
    vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::vector((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)0x1cee65);
    local_108 = (AtomType **)
                std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                          ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                           in_stack_fffffffffffffdd8);
    local_d0[0]._M_current = local_108;
    while( true ) {
      local_110 = (AtomType **)
                  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                             in_stack_fffffffffffffdd8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (!bVar1) break;
      local_e0 = 0;
      local_118 = (AtomType **)
                  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                             in_stack_fffffffffffffdd8);
      local_d8._M_current = local_118;
      while( true ) {
        local_120 = (AtomType **)
                    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                               in_stack_fffffffffffffdd8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffde0,
                           (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (!bVar1) break;
        local_100.second.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_dc + local_e0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1cef44);
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator*(local_d0);
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffdd8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
        std::__cxx11::string::~string(local_158);
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator*(&local_d8);
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffdd8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
        std::__cxx11::string::~string(local_178);
        in_stack_fffffffffffffdf0._M_current =
             (pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)TypeContainer<OpenMD::NonBondedInteractionType,_2>::find
                          ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                           in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        if ((ElemPtr)in_stack_fffffffffffffdf0._M_current != (ElemPtr)0x0) {
          std::
          make_pair<int&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    ((int *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          std::
          vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
          std::
          pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~pair((pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1cf049);
        }
        local_e0 = local_e0 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdf0._M_current);
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator++(&local_d8);
      }
      local_dc = local_dc + 1;
      __gnu_cxx::
      __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
      ::operator++(local_d0);
    }
    bVar1 = std::
            vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffdf0._M_current);
    if (bVar1) {
      local_8 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::find
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40);
    }
    else {
      __last._M_current = &local_100;
      this_00 = std::
                vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::begin((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)in_stack_fffffffffffffdd8);
      keys_00 = std::
                vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)in_stack_fffffffffffffdd8);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>>
                (in_stack_fffffffffffffdf0,__last);
      std::
      vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_100,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffe30,__x);
      local_8 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::find
                          ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)this_00._M_current,
                           (KeyType *)keys_00._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdf0._M_current);
    }
    std::
    vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)in_stack_fffffffffffffdf0._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffdf0._M_current);
    std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
              ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
               in_stack_fffffffffffffdf0._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0._M_current);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffdf0._M_current);
  return local_8;
}

Assistant:

NonBondedInteractionType* ForceField::getNonBondedInteractionType(
      const std::string& at1, const std::string& at2) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);

    // try exact match first
    NonBondedInteractionType* nbiType =
        nonBondedInteractionTypeCont_.find(keys);
    if (nbiType) {
      return nbiType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;

      int ii = 0;
      int jj = 0;
      int nbiTypeScore;

      std::vector<std::pair<int, std::vector<std::string>>> foundNBI;

      for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
        jj = 0;
        for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
          nbiTypeScore = ii + jj;

          std::vector<std::string> myKeys;
          myKeys.push_back((*i)->getName());
          myKeys.push_back((*j)->getName());

          NonBondedInteractionType* nbiType =
              nonBondedInteractionTypeCont_.find(myKeys);
          if (nbiType) {
            foundNBI.push_back(std::make_pair(nbiTypeScore, myKeys));
          }
          jj++;
        }
        ii++;
      }

      if (!foundNBI.empty()) {
        // sort the foundNBI by the score:
        std::sort(foundNBI.begin(), foundNBI.end());
        std::vector<std::string> theKeys = foundNBI[0].second;

        NonBondedInteractionType* bestType =
            nonBondedInteractionTypeCont_.find(theKeys);
        return bestType;
      } else {
        // if no exact match found, try wild card match
        return nonBondedInteractionTypeCont_.find(keys, wildCardAtomTypeName_);
      }
    }
  }